

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O1

void icu_63::initCanonicalIDCache(UErrorCode *status)

{
  gCanonicalIDCache =
       uhash_open_63(uhash_hashUChars_63,uhash_compareUChars_63,(undefined1 *)0x0,status);
  if (gCanonicalIDCache == (UHashtable *)0x0) {
    *status = U_MEMORY_ALLOCATION_ERROR;
  }
  if (U_ZERO_ERROR < *status) {
    gCanonicalIDCache = (UHashtable *)0x0;
  }
  ucln_i18n_registerCleanup_63(UCLN_I18N_ZONEMETA,zoneMeta_cleanup);
  return;
}

Assistant:

static void U_CALLCONV initCanonicalIDCache(UErrorCode &status) {
    gCanonicalIDCache = uhash_open(uhash_hashUChars, uhash_compareUChars, NULL, &status);
    if (gCanonicalIDCache == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
    }
    if (U_FAILURE(status)) {
        gCanonicalIDCache = NULL;
    }
    // No key/value deleters - keys/values are from a resource bundle
    ucln_i18n_registerCleanup(UCLN_I18N_ZONEMETA, zoneMeta_cleanup);
}